

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceVkImpl.hpp
# Opt level: O1

VulkanMemoryAllocation * __thiscall
Diligent::RenderDeviceVkImpl::AllocateMemory
          (VulkanMemoryAllocation *__return_storage_ptr__,RenderDeviceVkImpl *this,VkDeviceSize Size
          ,VkDeviceSize Alignment,uint32_t MemoryTypeIndex,VkMemoryAllocateFlags AllocateFlags)

{
  VulkanPhysicalDevice *pVVar1;
  string msg;
  string local_50;
  
  pVVar1 = (this->m_PhysicalDevice)._M_t.
           super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           ._M_t.
           super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
           .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl;
  if ((pVVar1->m_MemoryProperties).memoryTypeCount <= MemoryTypeIndex) {
    FormatString<char[26],char[46]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"MemoryTypeIndex < MemoryProps.memoryTypeCount",
               (char (*) [46])Alignment);
    DebugAssertionFailed
              (local_50._M_dataplus._M_p,"AllocateMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/RenderDeviceVkImpl.hpp"
               ,0xfc);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  VulkanUtilities::VulkanMemoryManager::Allocate
            (__return_storage_ptr__,&this->m_MemoryMgr,Size,Alignment,MemoryTypeIndex,
             SUB41((*(uint *)((long)(pVVar1->m_MemoryProperties).memoryTypes +
                             (ulong)MemoryTypeIndex * 8) & 2) >> 1,0),AllocateFlags);
  return __return_storage_ptr__;
}

Assistant:

VulkanUtilities::VulkanMemoryAllocation AllocateMemory(VkDeviceSize Size, VkDeviceSize Alignment, uint32_t MemoryTypeIndex, VkMemoryAllocateFlags AllocateFlags = 0)
    {
        const auto& MemoryProps = m_PhysicalDevice->GetMemoryProperties();
        VERIFY_EXPR(MemoryTypeIndex < MemoryProps.memoryTypeCount);
        const auto MemoryFlags = MemoryProps.memoryTypes[MemoryTypeIndex].propertyFlags;
        return m_MemoryMgr.Allocate(Size, Alignment, MemoryTypeIndex, (MemoryFlags & VK_MEMORY_PROPERTY_HOST_VISIBLE_BIT) != 0, AllocateFlags);
    }